

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::Molecule::getCom(Vector3d *__return_storage_ptr__,Molecule *this,int snapshotNo)

{
  double s;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  StuntDouble *this_00;
  pointer ppSVar2;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>);
  ppSVar2 = (this->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar1 = extraout_RDX;
  if (ppSVar2 !=
      (this->integrableObjects_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_001a292b;
  this_00 = (StuntDouble *)0x0;
  do {
    do {
      if (this_00 == (StuntDouble *)0x0) {
        Vector<double,_3U>::div(&__return_storage_ptr__->super_Vector<double,_3U>,0,(int)uVar1);
        return __return_storage_ptr__;
      }
      s = this_00->mass_;
      StuntDouble::getPos((Vector3d *)&local_60,this_00,snapshotNo);
      operator*(&local_48,&local_60,s);
      Vector<double,_3U>::add(&__return_storage_ptr__->super_Vector<double,_3U>,&local_48);
      ppSVar2 = ppSVar2 + 1;
      this_00 = (StuntDouble *)0x0;
      uVar1 = extraout_RDX_00;
    } while (ppSVar2 ==
             (this->integrableObjects_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
LAB_001a292b:
    this_00 = *ppSVar2;
  } while( true );
}

Assistant:

Vector3d Molecule::getCom(int snapshotNo) {
    StuntDouble* sd;
    std::vector<StuntDouble*>::iterator i;
    Vector3d com {};
    RealType totalMass {};
    RealType mass {};

    for (sd = beginIntegrableObject(i); sd != NULL;
         sd = nextIntegrableObject(i)) {
      mass = sd->getMass();
      totalMass += mass;
      com += sd->getPos(snapshotNo) * mass;
    }

    com /= totalMass;

    return com;
  }